

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char,_unsigned_short>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_char,unsigned_short>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char,_unsigned_short>
           *__return_storage_ptr__,v10 *this,uchar *args,unsigned_short *args_1)

{
  unsigned_short *args_local_1;
  uchar *args_local;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  longlong local_98;
  size_t local_90;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  longlong local_58;
  size_t local_50;
  
  local_98._0_4_ = (uint)(byte)*this;
  local_58._0_4_ = (uint)*(ushort *)args;
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = local_98;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_90;
  (__return_storage_ptr__->data_).args_[1].field_0.long_long_value = local_58;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_50;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}